

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O0

int Ssw_MiterStatus(Aig_Man_t *p,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint local_40;
  uint local_3c;
  int CountUndecided;
  int CountNonConst0;
  int CountConst0;
  int i;
  Aig_Obj_t *pChild;
  Aig_Obj_t *pObj;
  int fVerbose_local;
  Aig_Man_t *p_local;
  
  CountUndecided = 0;
  local_3c = 0;
  local_40 = 0;
  CountNonConst0 = 0;
  do {
    iVar2 = Saig_ManPoNum(p);
    if (iVar2 <= CountNonConst0) {
      if (fVerbose != 0) {
        uVar3 = Saig_ManPoNum(p);
        Abc_Print(1,"Miter has %d outputs. ",(ulong)uVar3);
        Abc_Print(1,"Const0 = %d.  ",(ulong)(uint)CountUndecided);
        Abc_Print(1,"NonConst0 = %d.  ",(ulong)local_3c);
        Abc_Print(1,"Undecided = %d.  ",(ulong)local_40);
        Abc_Print(1,"\n");
      }
      if (local_3c == 0) {
        if (local_40 == 0) {
          p_local._4_4_ = 1;
        }
        else {
          p_local._4_4_ = -1;
        }
      }
      else {
        p_local._4_4_ = 0;
      }
      return p_local._4_4_;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,CountNonConst0);
    pAVar4 = Aig_ObjChild0(pAVar4);
    pAVar5 = Aig_ManConst0(p);
    if (pAVar4 == pAVar5) {
      CountUndecided = CountUndecided + 1;
    }
    else {
      pAVar5 = Aig_ManConst1(p);
      if (pAVar4 == pAVar5) {
        local_3c = local_3c + 1;
      }
      else {
        if (p->nRegs == 0) {
          pAVar5 = Aig_Regular(pAVar4);
          iVar2 = Aig_ObjIsCi(pAVar5);
          if (iVar2 != 0) {
            local_3c = local_3c + 1;
            goto LAB_0087ce46;
          }
        }
        pAVar5 = Aig_Regular(pAVar4);
        uVar1 = *(ulong *)&pAVar5->field_0x18;
        uVar3 = Aig_IsComplement(pAVar4);
        if (((uint)(uVar1 >> 3) & 1) == uVar3) {
          local_40 = local_40 + 1;
        }
        else {
          local_3c = local_3c + 1;
        }
      }
    }
LAB_0087ce46:
    CountNonConst0 = CountNonConst0 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reports the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ssw_MiterStatus( Aig_Man_t * p, int fVerbose )
{
    Aig_Obj_t * pObj, * pChild;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
//    if ( p->pData )
//        return 0;
    Saig_ManForEachPo( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
        {
            CountConst0++;
            continue;
        }
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is a primary input
        if ( p->nRegs == 0 && Aig_ObjIsCi(Aig_Regular(pChild)) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }

    if ( fVerbose )
    {
        Abc_Print( 1, "Miter has %d outputs. ", Saig_ManPoNum(p) );
        Abc_Print( 1, "Const0 = %d.  ", CountConst0 );
        Abc_Print( 1, "NonConst0 = %d.  ", CountNonConst0 );
        Abc_Print( 1, "Undecided = %d.  ", CountUndecided );
        Abc_Print( 1, "\n" );
    }

    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}